

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O1

container_t * convert_run_to_efficient_container(run_container_t *c,uint8_t *typecode_after)

{
  uint16_t uVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  rle16_t *prVar5;
  uint16_t *puVar6;
  int32_t iVar7;
  int iVar8;
  array_container_t *paVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  byte bVar15;
  uint uVar16;
  uint8_t uVar17;
  uint uVar18;
  
  iVar4 = c->n_runs;
  iVar8 = run_container_cardinality(c);
  iVar11 = 0x1ffe;
  if (iVar8 * 2 < 0x1ffe) {
    iVar11 = iVar8 * 2;
  }
  uVar17 = '\x03';
  paVar9 = (array_container_t *)c;
  if (iVar11 < iVar4 * 4) {
    if (iVar8 < 0x1001) {
      paVar9 = array_container_create_given_capacity(iVar8);
      paVar9->cardinality = 0;
      iVar4 = c->n_runs;
      uVar17 = '\x02';
      if (0 < (long)iVar4) {
        prVar5 = c->runs;
        puVar6 = paVar9->array;
        lVar13 = 0;
        iVar7 = paVar9->cardinality;
        do {
          iVar11 = iVar7;
          uVar1 = prVar5[lVar13].value;
          uVar2 = prVar5[lVar13].length;
          lVar14 = 0;
          do {
            puVar6[iVar11 + lVar14] = uVar1 + (short)lVar14;
            lVar14 = lVar14 + 1;
            iVar8 = (int)lVar14;
          } while (uVar2 + 1 != iVar8);
          lVar13 = lVar13 + 1;
          iVar7 = iVar11 + iVar8;
        } while (lVar13 != iVar4);
        paVar9->cardinality = iVar11 + iVar8;
      }
    }
    else {
      paVar9 = (array_container_t *)bitset_container_create();
      iVar4 = c->n_runs;
      if (0 < (long)iVar4) {
        prVar5 = c->runs;
        puVar6 = paVar9->array;
        lVar13 = 0;
        do {
          uVar2 = prVar5[lVar13].value;
          uVar3 = prVar5[lVar13].length;
          if ((uint)uVar3 + (uint)uVar2 + 1 != (uint)uVar2) {
            uVar16 = (uint)uVar3 + (uint)uVar2;
            uVar12 = (uint)(uVar2 >> 6);
            uVar10 = -1L << ((byte)uVar2 & 0x3f);
            uVar18 = uVar16 >> 6;
            bVar15 = (byte)uVar16;
            if (uVar18 - uVar12 == 0) {
              bVar15 = ~bVar15;
              uVar10 = (uVar10 << (bVar15 & 0x3f)) >> (bVar15 & 0x3f);
              uVar18 = uVar12;
            }
            else {
              *(ulong *)(puVar6 + (ulong)uVar12 * 4) =
                   *(ulong *)(puVar6 + (ulong)uVar12 * 4) | uVar10;
              if (uVar12 + 1 < uVar18) {
                memset(puVar6 + (ulong)(uVar2 >> 6) * 4 + 4,0xff,
                       (ulong)((uVar18 - uVar12) - 2) * 8 + 8);
              }
              uVar10 = 0xffffffffffffffff >> (~bVar15 & 0x3f);
            }
            *(ulong *)(puVar6 + (ulong)uVar18 * 4) = *(ulong *)(puVar6 + (ulong)uVar18 * 4) | uVar10
            ;
          }
          lVar13 = lVar13 + 1;
        } while (iVar4 != lVar13);
      }
      paVar9->cardinality = iVar8;
      uVar17 = '\x01';
    }
  }
  *typecode_after = uVar17;
  return paVar9;
}

Assistant:

container_t *convert_run_to_efficient_container(run_container_t *c,
                                                uint8_t *typecode_after) {
    int32_t size_as_run_container =
        run_container_serialized_size_in_bytes(c->n_runs);

    int32_t size_as_bitset_container =
        bitset_container_serialized_size_in_bytes();
    int32_t card = run_container_cardinality(c);
    int32_t size_as_array_container =
        array_container_serialized_size_in_bytes(card);

    int32_t min_size_non_run =
        size_as_bitset_container < size_as_array_container
            ? size_as_bitset_container
            : size_as_array_container;
    if (size_as_run_container <= min_size_non_run) {  // no conversion
        *typecode_after = RUN_CONTAINER_TYPE;
        return c;
    }
    if (card <= DEFAULT_MAX_SIZE) {
        // to array
        array_container_t *answer = array_container_create_given_capacity(card);
        answer->cardinality = 0;
        for (int rlepos = 0; rlepos < c->n_runs; ++rlepos) {
            int run_start = c->runs[rlepos].value;
            int run_end = run_start + c->runs[rlepos].length;

            for (int run_value = run_start; run_value <= run_end; ++run_value) {
                answer->array[answer->cardinality++] = (uint16_t)run_value;
            }
        }
        *typecode_after = ARRAY_CONTAINER_TYPE;
        return answer;
    }

    // else to bitset
    bitset_container_t *answer = bitset_container_create();

    for (int rlepos = 0; rlepos < c->n_runs; ++rlepos) {
        int start = c->runs[rlepos].value;
        int end = start + c->runs[rlepos].length;
        bitset_set_range(answer->words, start, end + 1);
    }
    answer->cardinality = card;
    *typecode_after = BITSET_CONTAINER_TYPE;
    return answer;
}